

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

void __thiscall Lodtalk::NativeError::NativeError(NativeError *this,string *errorMessage)

{
  pointer pcVar1;
  
  this->super_NativeException = (NativeException)&PTR__NativeError_00163b20;
  (this->errorMessage)._M_dataplus._M_p = (pointer)&(this->errorMessage).field_2;
  pcVar1 = (errorMessage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->errorMessage,pcVar1,pcVar1 + errorMessage->_M_string_length);
  return;
}

Assistant:

virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}